

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::VersionSet::Builder::SaveTo(Builder *this,Version *v)

{
  VersionSet *pVVar1;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  __last;
  FileSet *pFVar2;
  size_type sVar3;
  size_type sVar4;
  FILE *__stream;
  _Alloc_hider _Var5;
  int iVar6;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  _Var7;
  _Base_ptr p_Var8;
  pointer ppFVar9;
  ulong uVar10;
  uint uVar11;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  __first;
  _Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  InternalKeyComparator *pIVar12;
  long lVar13;
  InternalKey *this_01;
  InternalKey *this_02;
  long in_FS_OFFSET;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pVVar1 = this->vset_;
  lVar13 = 0;
  do {
    __first._M_current =
         this->base_->files_[lVar13].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         this->base_->files_[lVar13].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    pFVar2 = this->levels_[lVar13].added_files;
    this_00 = &v->files_[lVar13].
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
    ;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)this_00,
               ((long)__last._M_current - (long)__first._M_current >> 3) +
               (pFVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
    iVar6 = (int)lVar13;
    for (p_Var8 = (pFVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(pFVar2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8)) {
      _Var7 = std::
              __upper_bound<__gnu_cxx::__normal_iterator<leveldb::FileMetaData*const*,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,leveldb::FileMetaData*,__gnu_cxx::__ops::_Val_comp_iter<leveldb::VersionSet::Builder::BySmallestKey>>
                        (__first,__last,(FileMetaData **)(p_Var8 + 1),
                         (_Val_comp_iter<leveldb::VersionSet::Builder::BySmallestKey>)&pVVar1->icmp_
                        );
      for (; __first._M_current != _Var7._M_current; __first._M_current = __first._M_current + 1) {
        MaybeAddFile(this,v,iVar6,*__first._M_current);
      }
      MaybeAddFile(this,v,iVar6,*(FileMetaData **)(p_Var8 + 1));
    }
    for (; __first._M_current != __last._M_current; __first._M_current = __first._M_current + 1) {
      MaybeAddFile(this,v,iVar6,*__first._M_current);
    }
    if ((lVar13 != 0) &&
       (ppFVar9 = (this_00->_M_impl).super__Vector_impl_data._M_start,
       8 < (ulong)((long)(this_00->_M_impl).super__Vector_impl_data._M_finish - (long)ppFVar9))) {
      uVar10 = 1;
      uVar11 = 2;
      do {
        sVar3 = (ppFVar9[uVar11 - 2]->largest).rep_._M_string_length;
        if (sVar3 == 0) {
LAB_00cffb59:
          __assert_fail("!rep_.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.h"
                        ,0x96,"Slice leveldb::InternalKey::Encode() const");
        }
        this_02 = &ppFVar9[uVar11 - 2]->largest;
        local_58._M_dataplus._M_p = (this_02->rep_)._M_dataplus._M_p;
        sVar4 = (ppFVar9[uVar10]->smallest).rep_._M_string_length;
        local_58._M_string_length = sVar3;
        if (sVar4 == 0) goto LAB_00cffb59;
        this_01 = &ppFVar9[uVar10]->smallest;
        pIVar12 = &this->vset_->icmp_;
        local_78._M_dataplus._M_p = (this_01->rep_)._M_dataplus._M_p;
        local_78._M_string_length = sVar4;
        iVar6 = (*(pIVar12->super_Comparator)._vptr_Comparator[2])(pIVar12,&local_58,&local_78);
        __stream = _stderr;
        if (-1 < iVar6) {
          InternalKey::DebugString_abi_cxx11_(&local_58,this_02);
          _Var5._M_p = local_58._M_dataplus._M_p;
          InternalKey::DebugString_abi_cxx11_(&local_78,this_01);
          fprintf(__stream,"overlapping ranges in same level %s vs. %s\n",_Var5._M_p,
                  local_78._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_58);
          abort();
        }
        uVar10 = (ulong)uVar11;
        ppFVar9 = (this_00->_M_impl).super__Vector_impl_data._M_start;
        uVar11 = uVar11 + 1;
      } while (uVar10 < (ulong)((long)(this_00->_M_impl).super__Vector_impl_data._M_finish -
                                (long)ppFVar9 >> 3));
    }
    lVar13 = lVar13 + 1;
    if (lVar13 == 7) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void SaveTo(Version* v) {
    BySmallestKey cmp;
    cmp.internal_comparator = &vset_->icmp_;
    for (int level = 0; level < config::kNumLevels; level++) {
      // Merge the set of added files with the set of pre-existing files.
      // Drop any deleted files.  Store the result in *v.
      const std::vector<FileMetaData*>& base_files = base_->files_[level];
      std::vector<FileMetaData*>::const_iterator base_iter = base_files.begin();
      std::vector<FileMetaData*>::const_iterator base_end = base_files.end();
      const FileSet* added_files = levels_[level].added_files;
      v->files_[level].reserve(base_files.size() + added_files->size());
      for (const auto& added_file : *added_files) {
        // Add all smaller files listed in base_
        for (std::vector<FileMetaData*>::const_iterator bpos =
                 std::upper_bound(base_iter, base_end, added_file, cmp);
             base_iter != bpos; ++base_iter) {
          MaybeAddFile(v, level, *base_iter);
        }

        MaybeAddFile(v, level, added_file);
      }

      // Add remaining base files
      for (; base_iter != base_end; ++base_iter) {
        MaybeAddFile(v, level, *base_iter);
      }

#ifndef NDEBUG
      // Make sure there is no overlap in levels > 0
      if (level > 0) {
        for (uint32_t i = 1; i < v->files_[level].size(); i++) {
          const InternalKey& prev_end = v->files_[level][i - 1]->largest;
          const InternalKey& this_begin = v->files_[level][i]->smallest;
          if (vset_->icmp_.Compare(prev_end, this_begin) >= 0) {
            fprintf(stderr, "overlapping ranges in same level %s vs. %s\n",
                    prev_end.DebugString().c_str(),
                    this_begin.DebugString().c_str());
            abort();
          }
        }
      }
#endif
    }
  }